

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonToken.cpp
# Opt level: O2

RefToken CommonToken::factory(void)

{
  CommonToken *this;
  Ref *in_RDI;
  
  this = (CommonToken *)operator_new(0x30);
  CommonToken(this);
  RefCount<Token>::RefCount((RefCount<Token> *)in_RDI,(Token *)this);
  return (RefToken)in_RDI;
}

Assistant:

RefToken CommonToken::factory()
{
	return RefToken(new CommonToken);
}